

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O1

string * __thiscall
t_erl_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_erl_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  pointer pcVar3;
  long *plVar4;
  long *plVar5;
  pointer pptVar6;
  long *local_c8;
  long local_b8;
  long lStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  t_program *local_a0;
  t_erl_generator *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  ptVar1 = (this->super_t_generator).program_;
  local_a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
  local_98 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar6 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_a0 = ptVar1;
  if (pptVar6 != pptVar2) {
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar3 = ((*pptVar6)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + ((*pptVar6)->name_)._M_string_length);
      make_safe_for_module_name(&local_50,local_98,&local_70);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x387e2b);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar4[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
        local_90 = (long *)*plVar4;
      }
      local_88 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_b8 = *plVar5;
        lStack_b0 = plVar4[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar5;
        local_c8 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 != pptVar2);
  }
  if ((local_a0->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_a0->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_erl_generator::render_includes() {
  const vector<t_program*>& includes = program_->get_includes();
  string result = "";
  for (auto include : includes) {
    result += "-include(\"" + make_safe_for_module_name(include->get_name())
              + "_types.hrl\").\n";
  }
  if (includes.size() > 0) {
    result += "\n";
  }
  return result;
}